

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

shared_ptr<kratos::Stmt> __thiscall
kratos::RemoveEmptyBlockVisitor::dispatch_node
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::Stmt> *stmt)

{
  int iVar1;
  _Atomic_word _Var2;
  _Atomic_word _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<kratos::Stmt> sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  shared_ptr<kratos::Stmt> local_68;
  shared_ptr<kratos::Stmt> local_58;
  shared_ptr<kratos::Stmt> local_48;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  iVar1 = *(int *)((in_RDX._M_pi)->_vptr__Sp_counted_base + 0xf);
  if (iVar1 == 4) {
    std::static_pointer_cast<kratos::ScopedStmtBlock,kratos::Stmt>(&local_68);
    _Stack_70._M_pi =
         local_68.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    this_00 = &local_68.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_68.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    process((RemoveEmptyBlockVisitor *)local_38,(shared_ptr<kratos::StmtBlock> *)stmt);
    _Var4._M_pi = local_30._M_pi;
    (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)local_38;
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_IRVisitor).level = _Var4._M_pi;
    local_38 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  }
  else if (iVar1 == 1) {
    std::static_pointer_cast<kratos::SwitchStmt,kratos::Stmt>(&local_48);
    process((RemoveEmptyBlockVisitor *)local_38,(shared_ptr<kratos::SwitchStmt> *)stmt);
    _Var4._M_pi = local_30._M_pi;
    (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)local_38;
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_IRVisitor).level = _Var4._M_pi;
    local_38 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    this_00 = &local_48.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  else {
    if (iVar1 != 0) {
      (this->super_IRVisitor)._vptr_IRVisitor = (in_RDX._M_pi)->_vptr__Sp_counted_base;
      _Var2 = (in_RDX._M_pi)->_M_use_count;
      _Var3 = (in_RDX._M_pi)->_M_weak_count;
      (in_RDX._M_pi)->_M_use_count = 0;
      (in_RDX._M_pi)->_M_weak_count = 0;
      (this->super_IRVisitor).level = _Var2;
      *(_Atomic_word *)&(this->super_IRVisitor).field_0xc = _Var3;
      (in_RDX._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      goto LAB_001ec3dd;
    }
    std::static_pointer_cast<kratos::IfStmt,kratos::Stmt>(&local_58);
    process((RemoveEmptyBlockVisitor *)local_38,(shared_ptr<kratos::IfStmt> *)stmt);
    _Var4._M_pi = local_30._M_pi;
    (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)local_38;
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_IRVisitor).level = _Var4._M_pi;
    local_38 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    this_00 = &local_58.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  in_RDX._M_pi = extraout_RDX;
LAB_001ec3dd:
  sVar5.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Stmt>)
         sVar5.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Stmt> dispatch_node(std::shared_ptr<Stmt> stmt) {
        if (stmt->type() == StatementType::If) {
            return process(std::static_pointer_cast<IfStmt>(stmt));
        } else if (stmt->type() == StatementType::Switch) {
            return process(std::static_pointer_cast<SwitchStmt>(stmt));
        } else if (stmt->type() == StatementType::Block) {
            return process(std::static_pointer_cast<ScopedStmtBlock>(stmt));
        } else {
            return stmt;
        }
    }